

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_connect(quicly_conn_t **_conn,quicly_context_t *ctx,char *server_name,sockaddr *dest_addr
                  ,sockaddr *src_addr,quicly_cid_plaintext_t *new_cid,ptls_iovec_t address_token,
                  ptls_handshake_properties_t *handshake_properties,
                  quicly_transport_parameters_t *resumed_transport_params)

{
  ptls_iovec_t salt_00;
  uint32_t uVar1;
  uint8_t *puVar2;
  ptls_handshake_properties_t *properties;
  void *smallbuf;
  size_t in_RCX;
  uint8_t *in_RDX;
  st_quicly_cipher_context_t *in_RSI;
  undefined8 *in_RDI;
  uint8_t *in_R9;
  ptls_iovec_t pVar3;
  quicly_conn_t *in_stack_00000018;
  uint64_t *in_stack_00000020;
  int ret;
  size_t max_early_data_size;
  size_t epoch_offsets [5];
  ptls_buffer_t buf;
  quicly_cid_t *server_cid;
  quicly_conn_t *conn;
  st_ptls_salt_t *salt;
  void *in_stack_00000228;
  quicly_cid_t *in_stack_00000230;
  quicly_cid_t *in_stack_00000238;
  quicly_cid_t *in_stack_00000240;
  quicly_transport_parameters_t *in_stack_00000248;
  ptls_buffer_t *in_stack_00000250;
  undefined8 in_stack_00000260;
  uint8_t *smallbuf_00;
  quicly_conn_t *conn_00;
  quicly_conn_t *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 uVar6;
  quicly_conn_t *pqVar4;
  quicly_conn_t *pqVar5;
  void *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe90;
  uint uVar7;
  quicly_conn_t *pqVar8;
  ptls_t *tls;
  st_quicly_cipher_context_t *egress;
  st_quicly_cipher_context_t *ingress;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 uVar9;
  size_t sVar10;
  uint8_t *puVar11;
  undefined2 local_f8;
  undefined6 uStack_f6;
  ptls_iovec_t *in_stack_ffffffffffffff10;
  sockaddr *in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff22;
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  uint32_t protocol_version;
  quicly_context_t *in_stack_ffffffffffffff38;
  quicly_conn_t *local_c0;
  quicly_cid_plaintext_t *local_b8;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar12;
  size_t sVar13;
  undefined1 local_98 [80];
  quicly_cid_t *local_48;
  quicly_conn_t *local_40;
  st_ptls_salt_t *local_38;
  uint8_t *local_30;
  size_t local_20;
  uint8_t *local_18;
  st_quicly_cipher_context_t *local_10;
  undefined8 *local_8;
  
  protocol_version = (uint32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  pqVar8 = (quicly_conn_t *)&stack0x00000008;
  local_40 = (quicly_conn_t *)0x0;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_98,0,0x28);
  sVar13 = 0;
  local_38 = get_salt(*(uint32_t *)((long)&local_10[9].header_protection + 4));
  if (local_38 == (st_ptls_salt_t *)0x0) {
    if (((ulong)local_10[9].header_protection & 0xf0f0f0f00000000) != 0xa0a0a0a00000000) {
      iVar12 = 0xff08;
      goto LAB_00133e79;
    }
    local_38 = &quicly_connect::grease_salt;
  }
  uVar9 = *(undefined4 *)((long)&local_10[9].header_protection + 4);
  in_stack_fffffffffffffe70 = in_stack_00000018;
  uVar1 = quicly_cc_calc_initial_cwnd
                    (*(uint32_t *)&local_10[9].header_protection,
                     (uint16_t)local_10[5].header_protection);
  pqVar4 = (quicly_conn_t *)CONCAT44(uVar6,uVar1);
  pqVar5 = in_stack_fffffffffffffe70;
  local_40 = create_connection(in_stack_ffffffffffffff38,protocol_version,in_stack_ffffffffffffff28,
                               (sockaddr *)
                               CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20),
                               in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,local_b8,
                               (ptls_handshake_properties_t *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                               (uint32_t)sVar13);
  if (local_40 == (quicly_conn_t *)0x0) {
    iVar12 = 0x201;
  }
  else {
    *(byte *)&(local_40->super).remote.address_validation =
         *(byte *)&(local_40->super).remote.address_validation & 0xfe | 1;
    *(byte *)&(local_40->super).remote.address_validation =
         *(byte *)&(local_40->super).remote.address_validation & 0xfd | 2;
    ingress = local_10;
    puVar2 = local_18;
    sVar10 = local_20;
    puVar11 = local_30;
    if (*(long *)&(pqVar8->super).state != 0) {
      puVar2 = (uint8_t *)malloc(*(size_t *)&(pqVar8->super).state);
      (local_40->token).base = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        iVar12 = 0x201;
        goto LAB_00133e79;
      }
      memcpy((local_40->token).base,(pqVar8->super).ctx,*(size_t *)&(pqVar8->super).state);
      (local_40->token).len = *(size_t *)&(pqVar8->super).state;
      ingress = local_10;
      puVar2 = local_18;
      sVar10 = local_20;
      puVar11 = local_30;
    }
    local_48 = quicly_get_remote_cid(local_40);
    *(undefined8 *)(local_40->super).original_dcid.cid = *(undefined8 *)local_48->cid;
    *(undefined8 *)((local_40->super).original_dcid.cid + 8) = *(undefined8 *)(local_48->cid + 8);
    *(undefined4 *)((local_40->super).original_dcid.cid + 0x10) =
         *(undefined4 *)(local_48->cid + 0x10);
    (local_40->super).original_dcid.len = local_48->len;
    iVar12 = setup_handshake_space_and_flow(pqVar4,(size_t)in_stack_fffffffffffffe70);
    if (iVar12 == 0) {
      properties = (ptls_handshake_properties_t *)
                   get_aes128gcmsha256((quicly_context_t *)in_stack_fffffffffffffe70);
      iVar12 = (int)((ulong)&local_40->initial->cipher >> 0x20);
      egress = &(local_40->initial->cipher).egress;
      ptls_iovec_init(local_48,(ulong)local_48->len);
      pVar3 = ptls_iovec_init(local_38,0x14);
      smallbuf_00 = pVar3.base;
      local_c0 = (quicly_conn_t *)pVar3.len;
      pVar3.len = sVar10;
      pVar3.base = puVar2;
      salt_00.len = (size_t)pqVar5;
      salt_00.base = puVar11;
      pqVar5 = local_40;
      iVar12 = setup_initial_encryption
                         ((ptls_cipher_suite_t *)CONCAT44(uVar9,in_stack_fffffffffffffed0),ingress,
                          egress,pVar3,iVar12,salt_00,pqVar8);
      in_stack_fffffffffffffe70 = local_c0;
      if (iVar12 == 0) {
        ptls_buffer_init((ptls_buffer_t *)local_c0,smallbuf_00,0x133ab2);
        pqVar8 = (quicly_conn_t *)&(local_40->crypto).transport_params.buf;
        tls = (ptls_t *)&((local_40->super).ctx)->transport_params;
        if ((((local_40->super).ctx)->field_0xa2 & 1) == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)((local_40->super).ctx)->initial_egress_max_udp_payload_size;
        }
        smallbuf = (void *)(long)(int)uVar7;
        iVar12 = quicly_encode_transport_parameter_list
                           (in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000238,
                            in_stack_00000230,in_stack_00000228,in_stack_00000260);
        in_stack_fffffffffffffe70 = local_c0;
        if (iVar12 == 0) {
          puVar2 = (local_40->crypto).transport_params.buf.base;
          sVar10 = (local_40->crypto).transport_params.buf.off;
          *(ulong *)(local_40->crypto).transport_params.ext =
               CONCAT62(in_stack_ffffffffffffff22,0xffa5);
          (local_40->crypto).transport_params.ext[0].data.base = puVar2;
          (local_40->crypto).transport_params.ext[0].data.len = sVar10;
          pqVar4 = local_40;
          memset(&local_f8,0,0x18);
          local_f8 = 0xffff;
          *(ulong *)((pqVar4->crypto).transport_params.ext + 1) = CONCAT62(uStack_f6,0xffff);
          (pqVar4->crypto).transport_params.ext[1].data.base = (uint8_t *)in_stack_ffffffffffffff10;
          (pqVar4->crypto).transport_params.ext[1].data.len = (size_t)in_stack_ffffffffffffff18;
          (local_40->crypto).handshake_properties.additional_extensions =
               (local_40->crypto).transport_params.ext;
          (local_40->crypto).handshake_properties.collected_extensions = client_collected_extensions
          ;
          ptls_buffer_init((ptls_buffer_t *)local_c0,smallbuf,0x133c8b);
          if (in_stack_00000020 != (uint64_t *)0x0) {
            (local_40->crypto).handshake_properties.field_0.client.max_early_data_size =
                 (size_t *)&stack0xffffffffffffff60;
          }
          conn_00 = (quicly_conn_t *)&(local_40->crypto).handshake_properties;
          iVar12 = ptls_handle_message(tls,(ptls_buffer_t *)pqVar8,
                                       (size_t *)CONCAT44(uVar7,in_stack_fffffffffffffe90),
                                       (size_t)pqVar4,in_stack_fffffffffffffe80,(size_t)pqVar5,
                                       properties);
          (local_40->crypto).handshake_properties.field_0.client.max_early_data_size = (size_t *)0x0
          ;
          if (iVar12 == 0x202) {
            write_crypto_data(pqVar8,(ptls_buffer_t *)CONCAT44(uVar7,in_stack_fffffffffffffe90),
                              (size_t *)pqVar4);
            ptls_buffer_dispose((ptls_buffer_t *)CONCAT44(uVar7,in_stack_fffffffffffffe90));
            in_stack_fffffffffffffe70 = local_c0;
            if (sVar13 != 0) {
              (local_40->super).remote.transport_params.active_connection_id_limit =
                   in_stack_00000020[0xb];
              (local_40->super).remote.transport_params.max_data = in_stack_00000020[3];
              (local_40->super).remote.transport_params.max_stream_data.bidi_local =
                   *in_stack_00000020;
              (local_40->super).remote.transport_params.max_stream_data.bidi_remote =
                   in_stack_00000020[1];
              (local_40->super).remote.transport_params.max_stream_data.uni = in_stack_00000020[2];
              (local_40->super).remote.transport_params.max_streams_bidi = in_stack_00000020[5];
              (local_40->super).remote.transport_params.max_streams_uni = in_stack_00000020[6];
              iVar12 = apply_remote_transport_params(conn_00);
              in_stack_fffffffffffffe70 = local_c0;
              if (iVar12 != 0) goto LAB_00133e79;
            }
            *local_8 = local_40;
            iVar12 = 0;
          }
          else {
            in_stack_fffffffffffffe70 = local_c0;
            if (iVar12 < 1) {
              __assert_fail("ret > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                            ,0x8ce,
                            "int quicly_connect(quicly_conn_t **, quicly_context_t *, const char *, struct sockaddr *, struct sockaddr *, const quicly_cid_plaintext_t *, ptls_iovec_t, ptls_handshake_properties_t *, const quicly_transport_parameters_t *)"
                           );
            }
          }
        }
      }
    }
  }
LAB_00133e79:
  if (local_40 != (quicly_conn_t *)0x0) {
    unlock_now((quicly_conn_t *)0x133e91);
  }
  if ((iVar12 != 0) && (local_40 != (quicly_conn_t *)0x0)) {
    quicly_free(in_stack_fffffffffffffe70);
  }
  return iVar12;
}

Assistant:

int quicly_connect(quicly_conn_t **_conn, quicly_context_t *ctx, const char *server_name, struct sockaddr *dest_addr,
                   struct sockaddr *src_addr, const quicly_cid_plaintext_t *new_cid, ptls_iovec_t address_token,
                   ptls_handshake_properties_t *handshake_properties, const quicly_transport_parameters_t *resumed_transport_params)
{
    const struct st_ptls_salt_t *salt;
    quicly_conn_t *conn = NULL;
    const quicly_cid_t *server_cid;
    ptls_buffer_t buf;
    size_t epoch_offsets[5] = {0};
    size_t max_early_data_size = 0;
    int ret;

    if ((salt = get_salt(ctx->initial_version)) == NULL) {
        if ((ctx->initial_version & 0x0f0f0f0f) == 0x0a0a0a0a) {
            /* greasing version, use our own greasing salt */
            static const struct st_ptls_salt_t grease_salt = {.initial = {0xde, 0xad, 0xbe, 0xef, 0xde, 0xad, 0xbe,
                                                                          0xef, 0xde, 0xad, 0xbe, 0xef, 0xde, 0xad,
                                                                          0xbe, 0xef, 0xde, 0xad, 0xbe, 0xef}};
            salt = &grease_salt;
        } else {
            ret = QUICLY_ERROR_INVALID_INITIAL_VERSION;
            goto Exit;
        }
    }

    if ((conn = create_connection(
             ctx, ctx->initial_version, server_name, dest_addr, src_addr, NULL, new_cid, handshake_properties,
             quicly_cc_calc_initial_cwnd(ctx->initcwnd_packets, ctx->transport_params.max_udp_payload_size))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    conn->super.remote.address_validation.validated = 1;
    conn->super.remote.address_validation.send_probe = 1;
    if (address_token.len != 0) {
        if ((conn->token.base = malloc(address_token.len)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        memcpy(conn->token.base, address_token.base, address_token.len);
        conn->token.len = address_token.len;
    }
    server_cid = quicly_get_remote_cid(conn);
    conn->super.original_dcid = *server_cid;

    QUICLY_PROBE(CONNECT, conn, conn->stash.now, conn->super.version);

    if ((ret = setup_handshake_space_and_flow(conn, QUICLY_EPOCH_INITIAL)) != 0)
        goto Exit;
    if ((ret = setup_initial_encryption(get_aes128gcmsha256(ctx), &conn->initial->cipher.ingress, &conn->initial->cipher.egress,
                                        ptls_iovec_init(server_cid->cid, server_cid->len), 1,
                                        ptls_iovec_init(salt->initial, sizeof(salt->initial)), conn)) != 0)
        goto Exit;

    /* handshake (we always encode authentication CIDs, as we do not (yet) regenerate ClientHello when receiving Retry) */
    ptls_buffer_init(&conn->crypto.transport_params.buf, "", 0);
    if ((ret = quicly_encode_transport_parameter_list(
             &conn->crypto.transport_params.buf, &conn->super.ctx->transport_params, NULL, &conn->super.local.cid_set.cids[0].cid,
             NULL, NULL, conn->super.ctx->expand_client_hello ? conn->super.ctx->initial_egress_max_udp_payload_size : 0)) != 0)
        goto Exit;
    conn->crypto.transport_params.ext[0] =
        (ptls_raw_extension_t){QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS,
                               {conn->crypto.transport_params.buf.base, conn->crypto.transport_params.buf.off}};
    conn->crypto.transport_params.ext[1] = (ptls_raw_extension_t){UINT16_MAX};
    conn->crypto.handshake_properties.additional_extensions = conn->crypto.transport_params.ext;
    conn->crypto.handshake_properties.collected_extensions = client_collected_extensions;

    ptls_buffer_init(&buf, "", 0);
    if (resumed_transport_params != NULL)
        conn->crypto.handshake_properties.client.max_early_data_size = &max_early_data_size;
    ret = ptls_handle_message(conn->crypto.tls, &buf, epoch_offsets, 0, NULL, 0, &conn->crypto.handshake_properties);
    conn->crypto.handshake_properties.client.max_early_data_size = NULL;
    if (ret != PTLS_ERROR_IN_PROGRESS) {
        assert(ret > 0); /* no QUIC errors */
        goto Exit;
    }
    write_crypto_data(conn, &buf, epoch_offsets);
    ptls_buffer_dispose(&buf);

    if (max_early_data_size != 0) {
        /* when attempting 0-RTT, apply the remembered transport parameters */
#define APPLY(n) conn->super.remote.transport_params.n = resumed_transport_params->n
        APPLY(active_connection_id_limit);
        APPLY(max_data);
        APPLY(max_stream_data.bidi_local);
        APPLY(max_stream_data.bidi_remote);
        APPLY(max_stream_data.uni);
        APPLY(max_streams_bidi);
        APPLY(max_streams_uni);
#undef APPLY
        if ((ret = apply_remote_transport_params(conn)) != 0)
            goto Exit;
    }

    *_conn = conn;
    ret = 0;

Exit:
    if (conn != NULL)
        unlock_now(conn);
    if (ret != 0) {
        if (conn != NULL)
            quicly_free(conn);
    }
    return ret;
}